

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresdata.cpp
# Opt level: O2

Resource res_getTableItemByKey_63(ResourceData *pResData,Resource table,int32_t *indexR,char **key)

{
  ushort *puVar1;
  ushort uVar2;
  char *key_00;
  uint uVar3;
  int iVar4;
  int32_t iVar5;
  int32_t **ppiVar6;
  ulong uVar7;
  uint *puVar8;
  Resource RVar9;
  char *__s2;
  uint uVar10;
  uint uVar11;
  int iVar12;
  
  RVar9 = 0xffffffff;
  if ((key != (char **)0x0) && (key_00 = *key, key_00 != (char *)0x0)) {
    uVar3 = table & 0xfffffff;
    uVar10 = table >> 0x1c;
    if (uVar10 == 5) {
      puVar1 = pResData->p16BitUnits + uVar3;
      uVar2 = *puVar1;
      iVar5 = _res_findTableItem(pResData,puVar1 + 1,(uint)uVar2,key_00,key);
      *indexR = iVar5;
      if (-1 < iVar5) {
        uVar3 = (uint)(puVar1 + 1)[iVar5 + (uint)uVar2];
        if (pResData->poolStringIndex16Limit <= (int)uVar3) {
          uVar3 = (uVar3 - pResData->poolStringIndex16Limit) + pResData->poolStringIndexLimit;
        }
        RVar9 = uVar3 | 0x60000000;
      }
    }
    else {
      if (uVar10 == 4) {
        if (uVar3 == 0) {
          return 0xffffffff;
        }
        puVar8 = (uint *)(pResData->pRoot + uVar3 + 1);
        uVar3 = pResData->pRoot[uVar3];
        iVar12 = 0;
        uVar10 = uVar3;
        while( true ) {
          uVar7 = (ulong)uVar10;
          do {
            uVar10 = (uint)uVar7;
            if ((int)uVar10 <= iVar12) {
              *indexR = -1;
              return 0xffffffff;
            }
            uVar11 = uVar10 + iVar12 >> 1;
            uVar7 = (ulong)uVar11;
            ppiVar6 = &pResData->pRoot;
            if ((int)puVar8[uVar7] < 0) {
              ppiVar6 = (int32_t **)&pResData->poolBundleKeys;
            }
            __s2 = (char *)((ulong)(puVar8[uVar7] & 0x7fffffff) + (long)*ppiVar6);
            iVar4 = strcmp(key_00,__s2);
          } while (iVar4 < 0);
          if (iVar4 == 0) break;
          iVar12 = uVar11 + 1;
        }
        *key = __s2;
        *indexR = uVar11;
        uVar7 = (ulong)(int)(uVar3 + uVar11);
      }
      else {
        if (uVar10 != 2) {
          return 0xffffffff;
        }
        if (uVar3 == 0) {
          return 0xffffffff;
        }
        puVar1 = (ushort *)(pResData->pRoot + uVar3);
        uVar2 = *puVar1;
        uVar3 = _res_findTableItem(pResData,puVar1 + 1,(uint)uVar2,key_00,key);
        *indexR = uVar3;
        if ((int)uVar3 < 0) {
          return 0xffffffff;
        }
        puVar8 = (uint *)(puVar1 + 1 + (ulong)uVar2 + (ulong)(~(uint)uVar2 & 1));
        uVar7 = (ulong)uVar3;
      }
      RVar9 = puVar8[uVar7];
    }
  }
  return RVar9;
}

Assistant:

U_CAPI Resource U_EXPORT2
res_getTableItemByKey(const ResourceData *pResData, Resource table,
                      int32_t *indexR, const char **key) {
    uint32_t offset=RES_GET_OFFSET(table);
    int32_t length;
    int32_t idx;
    if(key == NULL || *key == NULL) {
        return RES_BOGUS;
    }
    switch(RES_GET_TYPE(table)) {
    case URES_TABLE: {
        if (offset!=0) { /* empty if offset==0 */
            const uint16_t *p= (const uint16_t *)(pResData->pRoot+offset);
            length=*p++;
            *indexR=idx=_res_findTableItem(pResData, p, length, *key, key);
            if(idx>=0) {
                const Resource *p32=(const Resource *)(p+length+(~length&1));
                return p32[idx];
            }
        }
        break;
    }
    case URES_TABLE16: {
        const uint16_t *p=pResData->p16BitUnits+offset;
        length=*p++;
        *indexR=idx=_res_findTableItem(pResData, p, length, *key, key);
        if(idx>=0) {
            return makeResourceFrom16(pResData, p[length+idx]);
        }
        break;
    }
    case URES_TABLE32: {
        if (offset!=0) { /* empty if offset==0 */
            const int32_t *p= pResData->pRoot+offset;
            length=*p++;
            *indexR=idx=_res_findTable32Item(pResData, p, length, *key, key);
            if(idx>=0) {
                return (Resource)p[length+idx];
            }
        }
        break;
    }
    default:
        break;
    }
    return RES_BOGUS;
}